

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O2

void __thiscall Polynomial::Polynomial(Polynomial *this,int numstates,int numvars)

{
  int iVar1;
  ulong in_RAX;
  int i;
  undefined8 local_28;
  
  this->mNumStates = numstates;
  this->mNumVariables = numvars;
  this->mFirstOperation = numvars + numstates;
  *(undefined8 *)&this->mResultLocation = 0;
  *(undefined8 *)
   ((long)&(this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined4 *)
   ((long)&(this->mOperands).
           super__Vector_base<Polynomial::operand,_std::allocator<Polynomial::operand>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->mOperands).
           super__Vector_base<Polynomial::operand,_std::allocator<Polynomial::operand>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->mOperands).
           super__Vector_base<Polynomial::operand,_std::allocator<Polynomial::operand>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  iVar1 = 0;
  local_28 = in_RAX;
  while (local_28 = CONCAT44(local_28._4_4_,iVar1), iVar1 < numstates) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&this->mEvaluationValues,
               (value_type_conflict *)&local_28);
    numstates = this->mNumStates;
    iVar1 = (int)local_28 + 1;
  }
  for (iVar1 = 0; iVar1 < this->mNumVariables; iVar1 = iVar1 + 1) {
    local_28 = local_28 & 0xffffffff;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)&this->mEvaluationValues,
               (int *)((long)&local_28 + 4));
  }
  return;
}

Assistant:

Polynomial::Polynomial(int numstates, int numvars)
  : mNumStates(numstates),
    mNumVariables(numvars),
    mFirstOperation(numstates + numvars),
    mResultLocation(0)
{
  for (int i=0; i < mNumStates; ++i)
    mEvaluationValues.push_back(i);
  for (int i=0; i < mNumVariables; ++i)
    mEvaluationValues.push_back(0);
}